

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O2

ly_bool lysp_schema_nodeid_match
                  (lysc_nodeid *nodeid,lysp_module *nodeid_pmod,lysp_ext_instance *nodeid_ext,
                  lysc_node *ctx_node,lysc_node *parent,lysp_node *pnode,lys_module *pnode_mod,
                  lysc_ext_instance *pnode_ext)

{
  char **ppcVar1;
  lys_module *plVar2;
  ulong uVar3;
  
  if ((pnode_ext == (lysc_ext_instance *)0x0) == (nodeid_ext == (lysp_ext_instance *)0x0)) {
    uVar3 = (ulong)(nodeid->count - 1);
    plVar2 = lys_schema_node_get_module(nodeid_pmod->mod->ctx,nodeid->prefix[uVar3],nodeid_pmod);
    if (plVar2 == (lys_module *)0x0) {
      __assert_fail("mod",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                    ,0x699,
                    "ly_bool lysp_schema_nodeid_match(const struct lysc_nodeid *, const struct lysp_module *, const struct lysp_ext_instance *, const struct lysc_node *, const struct lysc_node *, const struct lysp_node *, const struct lys_module *, const struct lysc_ext_instance *)"
                   );
    }
    if (pnode == (lysp_node *)0x0) goto LAB_0014c930;
    if ((plVar2 == pnode_mod) && (pnode->name == nodeid->name[uVar3])) {
      do {
        while( true ) {
          uVar3 = uVar3 - 1;
          if (uVar3 == 0xffffffffffffffff) {
            if (((ctx_node != (lysc_node *)0x0) && (parent != ctx_node)) ||
               ((ctx_node == (lysc_node *)0x0 &&
                (parent != (lysc_node *)0x0 || pnode_ext != (lysc_ext_instance *)0x0))))
            goto LAB_0014c91d;
            parent = (lysc_node *)0x1;
            goto LAB_0014c91f;
          }
          if (parent == (lysc_node *)0x0 && pnode_ext == (lysc_ext_instance *)0x0)
          goto LAB_0014c91d;
          plVar2 = lys_schema_node_get_module
                             (nodeid_pmod->mod->ctx,nodeid->prefix[uVar3],nodeid_pmod);
          if (plVar2 == (lys_module *)0x0) {
            __assert_fail("mod",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                          ,0x6b2,
                          "ly_bool lysp_schema_nodeid_match(const struct lysc_nodeid *, const struct lysp_module *, const struct lysp_ext_instance *, const struct lysc_node *, const struct lysc_node *, const struct lysp_node *, const struct lys_module *, const struct lysc_ext_instance *)"
                         );
          }
          if (parent == (lysc_node *)0x0) break;
LAB_0014c930:
          if ((parent->module != plVar2) || (parent->name != nodeid->name[uVar3]))
          goto LAB_0014c91d;
          parent = parent->parent;
        }
        if (pnode_ext->module != plVar2) goto LAB_0014c91d;
        ppcVar1 = &pnode_ext->argument;
        parent = (lysc_node *)0x0;
        pnode_ext = (lysc_ext_instance *)0x0;
      } while (*ppcVar1 == nodeid->name[uVar3]);
      goto LAB_0014c91f;
    }
  }
LAB_0014c91d:
  parent = (lysc_node *)0x0;
LAB_0014c91f:
  return (ly_bool)parent;
}

Assistant:

static ly_bool
lysp_schema_nodeid_match(const struct lysc_nodeid *nodeid, const struct lysp_module *nodeid_pmod,
        const struct lysp_ext_instance *nodeid_ext, const struct lysc_node *ctx_node, const struct lysc_node *parent,
        const struct lysp_node *pnode, const struct lys_module *pnode_mod, const struct lysc_ext_instance *pnode_ext)
{
    uint32_t i;
    const struct lys_module *mod;

    if (nodeid_ext && !pnode_ext) {
        /* extension instance augment and standard node, will never match */
        return 0;
    } else if (!nodeid_ext && pnode_ext) {
        /* standard augment and extension instance node, will never match */
        return 0;
    }

    /* compare last node in the node ID */
    i = nodeid->count - 1;

    /* get exp node ID module */
    mod = lys_schema_node_get_module(nodeid_pmod->mod->ctx, nodeid->prefix[i], nodeid_pmod);
    assert(mod);

    if (pnode) {
        /* compare on the last parsed-only node */
        if ((pnode_mod != mod) || (pnode->name != nodeid->name[i])) {
            return 0;
        }
    } else {
        /* using parent directly */
        if (!lysp_schema_nodeid_match_node(&parent, mod, nodeid->name[i])) {
            return 0;
        }
    }

    /* now compare all the compiled parents */
    while (i) {
        --i;

        if (!parent && !pnode_ext) {
            /* no more parents but path continues */
            return 0;
        }

        /* get exp node ID module */
        mod = lys_schema_node_get_module(nodeid_pmod->mod->ctx, nodeid->prefix[i], nodeid_pmod);
        assert(mod);

        if (parent) {
            /* compare with the parent */
            if (!lysp_schema_nodeid_match_node(&parent, mod, nodeid->name[i])) {
                return 0;
            }
        } else {
            /* compare with the ext instance */
            if (!lysp_schema_nodeid_match_ext(&pnode_ext, mod, nodeid->name[i])) {
                return 0;
            }
        }
    }

    if (ctx_node && (ctx_node != parent)) {
        /* descendant path has not finished in the context node */
        return 0;
    } else if (!ctx_node && (parent || pnode_ext)) {
        /* some parent/extension was not matched */
        return 0;
    }

    return 1;
}